

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * despot::util::tinyxml::TiXmlBase::GetEntity
                 (char *p,char *value,int *length,TiXmlEncoding encoding)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  unsigned_long input;
  long lVar9;
  TiXmlString ent;
  
  ent.rep_ = (Rep *)TiXmlString::nullrep_;
  *length = 0;
  if (p[1] == '#') {
    if (p[2] == 'x') {
      if (p[3] != '\0') {
        pbVar3 = (byte *)strchr(p + 3,0x3b);
        if ((pbVar3 != (byte *)0x0) && (*pbVar3 != 0)) {
          lVar9 = (long)pbVar3 - (long)p;
          iVar1 = 1;
          pcVar8 = (char *)0x0;
          input = 0;
          while( true ) {
            pbVar3 = pbVar3 + -1;
            bVar6 = *pbVar3;
            if (bVar6 == 0x78) break;
            if ((byte)(bVar6 - 0x30) < 10) {
              uVar7 = (uint)(byte)(bVar6 - 0x30);
            }
            else if ((byte)(bVar6 + 0x9f) < 6) {
              uVar7 = bVar6 - 0x57;
            }
            else {
              if (5 < (byte)(bVar6 + 0xbf)) goto LAB_00179cdd;
              uVar7 = bVar6 - 0x37;
            }
            input = input + uVar7 * iVar1;
            iVar1 = iVar1 << 4;
          }
          goto LAB_00179cba;
        }
      }
    }
    else {
      if (p[2] == '\0') goto LAB_00179b69;
      pcVar4 = strchr(p + 2,0x3b);
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        lVar9 = (long)pcVar4 - (long)p;
        iVar1 = 1;
        pcVar8 = (char *)0x0;
        input = 0;
        while( true ) {
          pcVar4 = pcVar4 + -1;
          if (*pcVar4 == '#') break;
          bVar6 = *pcVar4 - 0x30;
          if (9 < bVar6) goto LAB_00179cdd;
          input = input + (uint)bVar6 * iVar1;
          iVar1 = iVar1 * 10;
        }
LAB_00179cba:
        if (encoding == TIXML_ENCODING_UTF8) {
          ConvertUTF32ToUTF8(input,value,length);
        }
        else {
          *value = (char)input;
          *length = 1;
        }
        pcVar8 = p + lVar9 + 1;
        goto LAB_00179cdd;
      }
    }
    pcVar8 = (char *)0x0;
  }
  else {
LAB_00179b69:
    pcVar8 = p + 1;
    lVar9 = 0;
    do {
      lVar5 = lVar9;
      if (lVar5 + 0x10 == 0x60) {
        *value = *p;
        goto LAB_00179cdd;
      }
      pcVar4 = *(char **)((long)&entity + lVar5);
      uVar7 = *(uint *)((long)&DAT_0019fd68 + lVar5);
      iVar1 = strncmp(pcVar4,p,(ulong)uVar7);
      lVar9 = lVar5 + 0x10;
    } while (iVar1 != 0);
    sVar2 = strlen(pcVar4);
    if (sVar2 != uVar7) {
      __assert_fail("strlen(entity[i].str) == entity[i].strLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x1df,
                    "static const char *despot::util::tinyxml::TiXmlBase::GetEntity(const char *, char *, int *, TiXmlEncoding)"
                   );
    }
    *value = (&DAT_0019fd6c)[lVar5];
    *length = 1;
    pcVar8 = p + *(uint *)((long)&DAT_0019fd68 + lVar5);
  }
LAB_00179cdd:
  TiXmlString::quit(&ent);
  return pcVar8;
}

Assistant:

const char* TiXmlBase::GetEntity(const char* p, char* value, int* length,
	TiXmlEncoding encoding) {
	// Presume an entity, and pull it out.
	TIXML_STRING ent;
	int i;
	*length = 0;

	if (*(p + 1) && *(p + 1) == '#' && *(p + 2)) {
		unsigned long ucs = 0;
		ptrdiff_t delta = 0;
		unsigned mult = 1;

		if (*(p + 2) == 'x') {
			// Hexadecimal.
			if (!*(p + 3))
				return 0;

			const char* q = p + 3;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != 'x') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else if (*q >= 'a' && *q <= 'f')
					ucs += mult * (*q - 'a' + 10);
				else if (*q >= 'A' && *q <= 'F')
					ucs += mult * (*q - 'A' + 10);
				else
					return 0;
				mult *= 16;
				--q;
			}
		} else {
			// Decimal.
			if (!*(p + 2))
				return 0;

			const char* q = p + 2;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != '#') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else
					return 0;
				mult *= 10;
				--q;
			}
		}
		if (encoding == TIXML_ENCODING_UTF8) {
			// convert the UCS to UTF-8
			ConvertUTF32ToUTF8(ucs, value, length);
		} else {
			*value = (char) ucs;
			*length = 1;
		}
		return p + delta + 1;
	}

	// Now try to match it.
	for (i = 0; i < NUM_ENTITY; ++i) {
		if (strncmp(entity[i].str, p, entity[i].strLength) == 0) {
			assert(strlen(entity[i].str) == entity[i].strLength);
			*value = entity[i].chr;
			*length = 1;
			return (p + entity[i].strLength);
		}
	}

	// So it wasn't an entity, its unrecognized, or something like that.
	*value = *p; // Don't put back the last one, since we return it!
	//*length = 1;	// Leave unrecognized entities - this doesn't really work.
	// Just writes strange XML.
	return p + 1;
}